

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  undefined8 *__ptr;
  stbi_uc *psVar1;
  undefined8 in_RDI;
  stbi__jpeg *j;
  uchar *result;
  int in_stack_0000012c;
  int *in_stack_00000130;
  int *in_stack_00000138;
  int *in_stack_00000140;
  stbi__jpeg *in_stack_00000148;
  
  __ptr = (undefined8 *)stbi__malloc(0x1947ac);
  *__ptr = in_RDI;
  stbi__setup_jpeg((stbi__jpeg *)0x1947c8);
  psVar1 = load_jpeg_image(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                           in_stack_0000012c);
  free(__ptr);
  return psVar1;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}